

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvector.h
# Opt level: O2

size_t dg::ADT::
       SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
       ::_countBits(unsigned_long bits)

{
  size_t num;
  
  num = 0;
  for (; bits != 0; bits = bits >> 1) {
    num = num + ((uint)bits & 1);
  }
  return num;
}

Assistant:

static size_t _countBits(BitsT bits) {
        size_t num = 0;
        while (bits) {
            if (bits & 0x1)
                ++num;

            bits = bits >> 1;
        }

        return num;
    }